

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

presentation_type fmt::v10::detail::parse_printf_presentation_type(char c,type t)

{
  bool bVar1;
  presentation_type local_3d;
  presentation_type local_3b;
  presentation_type local_39;
  presentation_type local_37;
  presentation_type local_35;
  presentation_type local_33;
  presentation_type local_31;
  presentation_type local_2f;
  presentation_type local_2d;
  presentation_type local_2b;
  presentation_type local_29;
  presentation_type local_27;
  presentation_type local_25;
  presentation_type local_23;
  int integral_set;
  type t_local;
  char c_local;
  
  switch(c) {
  case 'A':
    bVar1 = in(t,0xe00);
    local_2b = hexfloat_upper;
    if (!bVar1) {
      local_2b = none;
    }
    integral_set._3_1_ = local_2b;
    break;
  default:
    integral_set._3_1_ = none;
    break;
  case 'E':
    bVar1 = in(t,0xe00);
    local_2f = exp_upper;
    if (!bVar1) {
      local_2f = none;
    }
    integral_set._3_1_ = local_2f;
    break;
  case 'F':
    bVar1 = in(t,0xe00);
    local_33 = fixed_upper;
    if (!bVar1) {
      local_33 = none;
    }
    integral_set._3_1_ = local_33;
    break;
  case 'G':
    bVar1 = in(t,0xe00);
    local_37 = general_upper;
    if (!bVar1) {
      local_37 = none;
    }
    integral_set._3_1_ = local_37;
    break;
  case 'X':
    bVar1 = in(t,0x1fe);
    local_27 = hex_upper;
    if (!bVar1) {
      local_27 = none;
    }
    integral_set._3_1_ = local_27;
    break;
  case 'a':
    bVar1 = in(t,0xe00);
    local_29 = hexfloat_lower;
    if (!bVar1) {
      local_29 = none;
    }
    integral_set._3_1_ = local_29;
    break;
  case 'c':
    bVar1 = in(t,0x1fe);
    local_39 = chr;
    if (!bVar1) {
      local_39 = none;
    }
    integral_set._3_1_ = local_39;
    break;
  case 'd':
    integral_set._3_1_ = in(t,0x1fe);
    break;
  case 'e':
    bVar1 = in(t,0xe00);
    local_2d = exp_lower;
    if (!bVar1) {
      local_2d = none;
    }
    integral_set._3_1_ = local_2d;
    break;
  case 'f':
    bVar1 = in(t,0xe00);
    local_31 = fixed_lower;
    if (!bVar1) {
      local_31 = none;
    }
    integral_set._3_1_ = local_31;
    break;
  case 'g':
    bVar1 = in(t,0xe00);
    local_35 = general_lower;
    if (!bVar1) {
      local_35 = none;
    }
    integral_set._3_1_ = local_35;
    break;
  case 'o':
    bVar1 = in(t,0x1fe);
    local_23 = oct;
    if (!bVar1) {
      local_23 = none;
    }
    integral_set._3_1_ = local_23;
    break;
  case 'p':
    bVar1 = in(t,0x5000);
    local_3d = pointer;
    if (!bVar1) {
      local_3d = none;
    }
    integral_set._3_1_ = local_3d;
    break;
  case 's':
    bVar1 = in(t,0x3000);
    local_3b = string;
    if (!bVar1) {
      local_3b = none;
    }
    integral_set._3_1_ = local_3b;
    break;
  case 'x':
    bVar1 = in(t,0x1fe);
    local_25 = hex_lower;
    if (!bVar1) {
      local_25 = none;
    }
    integral_set._3_1_ = local_25;
  }
  return integral_set._3_1_;
}

Assistant:

inline auto parse_printf_presentation_type(char c, type t)
    -> presentation_type {
  using pt = presentation_type;
  constexpr auto integral_set = sint_set | uint_set | bool_set | char_set;
  switch (c) {
  case 'd':
    return in(t, integral_set) ? pt::dec : pt::none;
  case 'o':
    return in(t, integral_set) ? pt::oct : pt::none;
  case 'x':
    return in(t, integral_set) ? pt::hex_lower : pt::none;
  case 'X':
    return in(t, integral_set) ? pt::hex_upper : pt::none;
  case 'a':
    return in(t, float_set) ? pt::hexfloat_lower : pt::none;
  case 'A':
    return in(t, float_set) ? pt::hexfloat_upper : pt::none;
  case 'e':
    return in(t, float_set) ? pt::exp_lower : pt::none;
  case 'E':
    return in(t, float_set) ? pt::exp_upper : pt::none;
  case 'f':
    return in(t, float_set) ? pt::fixed_lower : pt::none;
  case 'F':
    return in(t, float_set) ? pt::fixed_upper : pt::none;
  case 'g':
    return in(t, float_set) ? pt::general_lower : pt::none;
  case 'G':
    return in(t, float_set) ? pt::general_upper : pt::none;
  case 'c':
    return in(t, integral_set) ? pt::chr : pt::none;
  case 's':
    return in(t, string_set | cstring_set) ? pt::string : pt::none;
  case 'p':
    return in(t, pointer_set | cstring_set) ? pt::pointer : pt::none;
  default:
    return pt::none;
  }
}